

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint unfilter(uchar *out,uchar *in,uint w,uint h,uint bpp)

{
  ulong uVar1;
  long lVar2;
  byte bVar3;
  uchar uVar4;
  uchar uVar5;
  uchar uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uchar *puVar11;
  byte bVar12;
  byte bVar13;
  byte *pbVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  uchar *puVar19;
  uchar *puVar20;
  uchar *puVar21;
  long lVar22;
  uint uVar23;
  byte bVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  byte bVar29;
  byte bVar30;
  byte bVar31;
  uchar *puVar32;
  uchar *puVar33;
  uint uVar34;
  uchar *puVar36;
  long local_c8;
  uchar *local_a0;
  ulong uVar35;
  
  if (h == 0) {
    return 0;
  }
  uVar7 = bpp + 7;
  uVar34 = uVar7 >> 3;
  uVar35 = (ulong)uVar34;
  lVar25 = (ulong)bpp * (ulong)(w >> 3);
  uVar16 = (ulong)((w & 7) * bpp + 7 >> 3);
  uVar1 = lVar25 + uVar16;
  lVar26 = lVar25 + uVar16 + 1;
  puVar21 = in + 1;
  local_a0 = in + 3;
  lVar25 = -uVar35;
  local_c8 = (long)out - uVar35;
  puVar33 = in + 4;
  puVar11 = out + uVar35 + 3;
  lVar28 = uVar1 - uVar35;
  puVar32 = in + uVar35 + 4;
  puVar19 = out + uVar35;
  puVar20 = in + uVar35 + 1;
  uVar16 = 0;
  pbVar14 = (byte *)0x0;
  puVar36 = out;
  do {
    if (4 < in[lVar26 * uVar16]) {
      return 0x24;
    }
    lVar22 = uVar1 * uVar16;
    switch(in[lVar26 * uVar16]) {
    case '\0':
      if (uVar1 != 0) {
        uVar15 = 0;
        do {
          puVar36[uVar15] = puVar21[uVar15];
          uVar15 = uVar15 + 1;
        } while (uVar1 != uVar15);
      }
      break;
    case '\x01':
      if (7 < uVar7) {
        uVar15 = 0;
        do {
          puVar36[uVar15] = puVar21[uVar15];
          uVar15 = uVar15 + 1;
        } while (uVar35 != uVar15);
      }
      if (uVar35 < uVar1) {
        lVar27 = 0;
        do {
          puVar19[lVar27] = puVar36[lVar27] + puVar20[lVar27];
          lVar27 = lVar27 + 1;
        } while (lVar28 != lVar27);
      }
      break;
    case '\x02':
      if (pbVar14 == (byte *)0x0) {
        if (uVar1 != 0) {
          uVar15 = 0;
          do {
            puVar36[uVar15] = puVar21[uVar15];
            uVar15 = uVar15 + 1;
          } while (uVar1 != uVar15);
        }
      }
      else if (uVar1 != 0) {
        uVar15 = 0;
        do {
          puVar36[uVar15] = pbVar14[uVar15] + puVar21[uVar15];
          uVar15 = uVar15 + 1;
        } while (uVar1 != uVar15);
      }
      break;
    case '\x03':
      if (pbVar14 == (byte *)0x0) {
        if (7 < uVar7) {
          uVar15 = 0;
          do {
            puVar36[uVar15] = puVar21[uVar15];
            uVar15 = uVar15 + 1;
          } while (uVar35 != uVar15);
        }
        if (uVar35 < uVar1) {
          lVar27 = 0;
          do {
            puVar19[lVar27] = (puVar36[lVar27] >> 1) + puVar20[lVar27];
            lVar27 = lVar27 + 1;
          } while (lVar28 != lVar27);
        }
      }
      else {
        if (7 < uVar7) {
          uVar15 = 0;
          do {
            puVar36[uVar15] = (pbVar14[uVar15] >> 1) + puVar21[uVar15];
            uVar15 = uVar15 + 1;
          } while (uVar35 != uVar15);
        }
        if (uVar35 < uVar1) {
          lVar27 = 0;
          do {
            puVar19[lVar27] =
                 (char)((uint)pbVar14[lVar27 + uVar35] + (uint)puVar36[lVar27] >> 1) +
                 puVar20[lVar27];
            lVar27 = lVar27 + 1;
          } while (lVar28 != lVar27);
        }
      }
      break;
    case '\x04':
      if (pbVar14 == (byte *)0x0) {
        if (7 < uVar7) {
          uVar15 = 0;
          do {
            puVar36[uVar15] = puVar21[uVar15];
            uVar15 = uVar15 + 1;
          } while (uVar35 != uVar15);
        }
        if (uVar35 < uVar1) {
          lVar27 = 0;
          do {
            puVar19[lVar27] = puVar36[lVar27] + puVar20[lVar27];
            lVar27 = lVar27 + 1;
          } while (lVar28 != lVar27);
        }
      }
      else {
        if (uVar7 < 8) {
          uVar15 = 0;
        }
        else {
          uVar15 = 0;
          do {
            puVar36[uVar15] = pbVar14[uVar15] + puVar21[uVar15];
            uVar15 = uVar15 + 1;
          } while (uVar35 != uVar15);
          uVar15 = uVar35;
          if (uVar7 < 0x20) {
            if (uVar34 == 3) {
              uVar15 = 3;
              if (uVar35 + 2 < uVar1) {
                bVar24 = out[lVar22];
                uVar17 = 3;
                do {
                  bVar31 = pbVar14[uVar17];
                  bVar29 = pbVar14[uVar17 - 3];
                  uVar8 = (uint)bVar31 - (uint)bVar29;
                  uVar23 = -uVar8;
                  if (0 < (int)uVar8) {
                    uVar23 = uVar8;
                  }
                  uVar9 = (uint)bVar24 - (uint)bVar29;
                  uVar8 = -uVar9;
                  if (0 < (int)uVar9) {
                    uVar8 = uVar9;
                  }
                  uVar10 = (uint)bVar31 + (uint)bVar24 + (uint)bVar29 * -2;
                  uVar9 = -uVar10;
                  if (0 < (int)uVar10) {
                    uVar9 = uVar10;
                  }
                  uVar10 = uVar8 & 0xff;
                  if ((uVar23 & 0xff) <= (uVar8 & 0xff)) {
                    uVar10 = uVar23 & 0xff;
                    bVar31 = bVar24;
                  }
                  if (uVar10 <= uVar9) {
                    bVar29 = bVar31;
                  }
                  bVar31 = puVar36[uVar17 - 2];
                  bVar13 = pbVar14[uVar17 + 1];
                  bVar30 = pbVar14[uVar17 + 2];
                  bVar12 = pbVar14[uVar17 - 2];
                  bVar24 = bVar29 + puVar33[uVar17 - 3];
                  uVar8 = (uint)bVar13 - (uint)bVar12;
                  uVar23 = -uVar8;
                  if (0 < (int)uVar8) {
                    uVar23 = uVar8;
                  }
                  uVar23 = uVar23 & 0xff;
                  uVar9 = (uint)bVar31 - (uint)bVar12;
                  uVar8 = -uVar9;
                  if (0 < (int)uVar9) {
                    uVar8 = uVar9;
                  }
                  uVar10 = (uint)bVar13 + (uint)bVar31 + (uint)bVar12 * -2;
                  uVar9 = -uVar10;
                  if (0 < (int)uVar10) {
                    uVar9 = uVar10;
                  }
                  if ((uVar8 & 0xff) < uVar23) {
                    bVar31 = bVar13;
                    uVar23 = uVar8 & 0xff;
                  }
                  bVar29 = pbVar14[uVar17 - 1];
                  if (uVar9 < uVar23) {
                    bVar31 = bVar12;
                  }
                  uVar4 = puVar33[uVar17 - 2];
                  uVar8 = (uint)bVar30 - (uint)bVar29;
                  uVar23 = -uVar8;
                  if (0 < (int)uVar8) {
                    uVar23 = uVar8;
                  }
                  bVar13 = puVar36[uVar17 - 1];
                  uVar23 = uVar23 & 0xff;
                  uVar9 = (uint)bVar13 - (uint)bVar29;
                  uVar8 = -uVar9;
                  if (0 < (int)uVar9) {
                    uVar8 = uVar9;
                  }
                  uVar10 = (uint)bVar30 + (uint)bVar13 + (uint)bVar29 * -2;
                  uVar9 = -uVar10;
                  if (0 < (int)uVar10) {
                    uVar9 = uVar10;
                  }
                  if ((uVar8 & 0xff) < uVar23) {
                    bVar13 = bVar30;
                    uVar23 = uVar8 & 0xff;
                  }
                  if (uVar9 < uVar23) {
                    bVar13 = bVar29;
                  }
                  uVar5 = puVar33[uVar17 - 1];
                  puVar36[uVar17] = bVar24;
                  puVar36[uVar17 + 1] = bVar31 + uVar4;
                  puVar36[uVar17 + 2] = bVar13 + uVar5;
                  uVar15 = uVar17 + 3;
                  uVar18 = uVar17 + 5;
                  uVar17 = uVar15;
                } while (uVar18 < uVar1);
              }
            }
            else if (uVar35 + 1 < uVar1 && uVar34 != 1) {
              uVar17 = 2;
              do {
                bVar24 = *(byte *)(local_c8 + uVar17);
                bVar31 = *(byte *)(local_c8 + 1 + uVar17);
                bVar29 = pbVar14[uVar17];
                bVar13 = pbVar14[uVar17 + lVar25];
                uVar8 = (uint)bVar29 - (uint)bVar13;
                uVar23 = -uVar8;
                if (0 < (int)uVar8) {
                  uVar23 = uVar8;
                }
                uVar23 = uVar23 & 0xff;
                uVar9 = (uint)bVar24 - (uint)bVar13;
                uVar8 = -uVar9;
                if (0 < (int)uVar9) {
                  uVar8 = uVar9;
                }
                uVar10 = (uint)bVar29 + (uint)bVar24 + (uint)bVar13 * -2;
                uVar9 = -uVar10;
                if (0 < (int)uVar10) {
                  uVar9 = uVar10;
                }
                bVar30 = pbVar14[uVar17 + 1];
                if ((uVar8 & 0xff) < uVar23) {
                  bVar24 = bVar29;
                  uVar23 = uVar8 & 0xff;
                }
                bVar29 = pbVar14[uVar17 + lVar25 + 1];
                if (uVar9 < uVar23) {
                  bVar24 = bVar13;
                }
                uVar8 = (uint)bVar30 - (uint)bVar29;
                uVar23 = -uVar8;
                if (0 < (int)uVar8) {
                  uVar23 = uVar8;
                }
                uVar23 = uVar23 & 0xff;
                uVar9 = (uint)bVar31 - (uint)bVar29;
                uVar8 = -uVar9;
                if (0 < (int)uVar9) {
                  uVar8 = uVar9;
                }
                uVar10 = (uint)bVar30 + (uint)bVar31 + (uint)bVar29 * -2;
                uVar9 = -uVar10;
                if (0 < (int)uVar10) {
                  uVar9 = uVar10;
                }
                if ((uVar8 & 0xff) < uVar23) {
                  bVar31 = bVar30;
                  uVar23 = uVar8 & 0xff;
                }
                if (uVar9 < uVar23) {
                  bVar31 = bVar29;
                }
                uVar4 = local_a0[uVar17 - 1];
                puVar36[uVar17] = bVar24 + local_a0[uVar17 - 2];
                puVar36[uVar17 + 1] = bVar31 + uVar4;
                uVar15 = uVar17 + 2;
                uVar18 = uVar17 + 3;
                uVar17 = uVar15;
              } while (uVar18 < uVar1);
            }
          }
          else if (uVar35 + 3 < uVar1) {
            lVar27 = 0;
            do {
              bVar24 = puVar36[lVar27];
              bVar31 = puVar36[lVar27 + 1];
              bVar29 = pbVar14[lVar27 + uVar35];
              bVar13 = pbVar14[lVar27];
              uVar8 = (uint)bVar29 - (uint)bVar13;
              uVar23 = -uVar8;
              if (0 < (int)uVar8) {
                uVar23 = uVar8;
              }
              bVar30 = puVar36[lVar27 + 2];
              uVar23 = uVar23 & 0xff;
              uVar9 = (uint)bVar24 - (uint)bVar13;
              uVar8 = -uVar9;
              if (0 < (int)uVar9) {
                uVar8 = uVar9;
              }
              uVar8 = uVar8 & 0xff;
              uVar10 = (uint)bVar29 + (uint)bVar24 + (uint)bVar13 * -2;
              uVar9 = -uVar10;
              if (0 < (int)uVar10) {
                uVar9 = uVar10;
              }
              bVar12 = pbVar14[lVar27 + uVar35 + 1];
              uVar10 = uVar8;
              if (uVar23 <= uVar8) {
                uVar10 = uVar23;
              }
              bVar3 = pbVar14[lVar27 + uVar35 + 2];
              if (uVar23 > uVar8) {
                bVar24 = bVar29;
              }
              if (uVar9 < uVar10) {
                bVar24 = bVar13;
              }
              bVar29 = pbVar14[lVar27 + 1];
              uVar8 = (uint)bVar12 - (uint)bVar29;
              uVar23 = -uVar8;
              if (0 < (int)uVar8) {
                uVar23 = uVar8;
              }
              uVar23 = uVar23 & 0xff;
              uVar9 = (uint)bVar31 - (uint)bVar29;
              uVar8 = -uVar9;
              if (0 < (int)uVar9) {
                uVar8 = uVar9;
              }
              uVar10 = (uint)bVar31 + (uint)bVar12 + (uint)bVar29 * -2;
              uVar9 = -uVar10;
              if (0 < (int)uVar10) {
                uVar9 = uVar10;
              }
              bVar13 = pbVar14[lVar27 + uVar35 + 3];
              if ((uVar8 & 0xff) < uVar23) {
                uVar23 = uVar8 & 0xff;
                bVar31 = bVar12;
              }
              bVar12 = pbVar14[lVar27 + 2];
              if (uVar9 < uVar23) {
                bVar31 = bVar29;
              }
              uVar4 = puVar32[lVar27 + -2];
              uVar8 = (uint)bVar3 - (uint)bVar12;
              uVar23 = -uVar8;
              if (0 < (int)uVar8) {
                uVar23 = uVar8;
              }
              uVar23 = uVar23 & 0xff;
              uVar9 = (uint)bVar30 - (uint)bVar12;
              uVar8 = -uVar9;
              if (0 < (int)uVar9) {
                uVar8 = uVar9;
              }
              uVar10 = (uint)bVar3 + (uint)bVar30 + (uint)bVar12 * -2;
              uVar9 = -uVar10;
              if (0 < (int)uVar10) {
                uVar9 = uVar10;
              }
              if ((uVar8 & 0xff) < uVar23) {
                bVar30 = bVar3;
                uVar23 = uVar8 & 0xff;
              }
              bVar29 = pbVar14[lVar27 + 3];
              if (uVar9 < uVar23) {
                bVar30 = bVar12;
              }
              uVar5 = puVar32[lVar27 + -1];
              uVar8 = (uint)bVar13 - (uint)bVar29;
              uVar23 = -uVar8;
              if (0 < (int)uVar8) {
                uVar23 = uVar8;
              }
              bVar12 = puVar36[lVar27 + 3];
              uVar23 = uVar23 & 0xff;
              uVar9 = (uint)bVar12 - (uint)bVar29;
              uVar8 = -uVar9;
              if (0 < (int)uVar9) {
                uVar8 = uVar9;
              }
              uVar10 = (uint)bVar13 + (uint)bVar12 + (uint)bVar29 * -2;
              uVar9 = -uVar10;
              if (0 < (int)uVar10) {
                uVar9 = uVar10;
              }
              if ((uVar8 & 0xff) < uVar23) {
                bVar12 = bVar13;
                uVar23 = uVar8 & 0xff;
              }
              if (uVar9 < uVar23) {
                bVar12 = bVar29;
              }
              uVar6 = puVar32[lVar27];
              puVar11[lVar27 + -3] = bVar24 + puVar32[lVar27 + -3];
              puVar11[lVar27 + -2] = bVar31 + uVar4;
              puVar11[lVar27 + -1] = bVar30 + uVar5;
              puVar11[lVar27] = bVar12 + uVar6;
              lVar2 = lVar27 + uVar35;
              lVar27 = lVar27 + 4;
            } while (lVar2 + 7U < uVar1);
            uVar15 = lVar27 + uVar35;
          }
        }
        for (; uVar15 != uVar1; uVar15 = uVar15 + 1) {
          bVar24 = pbVar14[uVar15];
          bVar31 = pbVar14[uVar15 + lVar25];
          uVar8 = (uint)bVar24 - (uint)bVar31;
          uVar23 = -uVar8;
          if (0 < (int)uVar8) {
            uVar23 = uVar8;
          }
          bVar29 = *(byte *)(local_c8 + uVar15);
          uVar23 = uVar23 & 0xff;
          uVar9 = (uint)bVar29 - (uint)bVar31;
          uVar8 = -uVar9;
          if (0 < (int)uVar9) {
            uVar8 = uVar9;
          }
          uVar10 = (uint)bVar24 + (uint)bVar29 + (uint)bVar31 * -2;
          uVar9 = -uVar10;
          if (0 < (int)uVar10) {
            uVar9 = uVar10;
          }
          if ((uVar8 & 0xff) < uVar23) {
            bVar29 = bVar24;
            uVar23 = uVar8 & 0xff;
          }
          if (uVar9 < uVar23) {
            bVar29 = bVar31;
          }
          puVar36[uVar15] = bVar29 + puVar21[uVar15];
        }
      }
    }
    uVar16 = uVar16 + 1;
    puVar36 = puVar36 + uVar1;
    puVar21 = puVar21 + lVar26;
    local_a0 = local_a0 + lVar26;
    local_c8 = local_c8 + uVar1;
    puVar33 = puVar33 + lVar26;
    puVar11 = puVar11 + uVar1;
    puVar32 = puVar32 + lVar26;
    puVar19 = puVar19 + uVar1;
    puVar20 = puVar20 + lVar26;
    pbVar14 = out + lVar22;
  } while (uVar16 != h);
  return 0;
}

Assistant:

static unsigned unfilter(unsigned char* out, const unsigned char* in, unsigned w, unsigned h, unsigned bpp) {
  /*
  For PNG filter method 0
  this function unfilters a single image (e.g. without interlacing this is called once, with Adam7 seven times)
  out must have enough bytes allocated already, in must have the scanlines + 1 filtertype byte per scanline
  w and h are image dimensions or dimensions of reduced image, bpp is bits per pixel
  in and out are allowed to be the same memory address (but aren't the same size since in has the extra filter bytes)
  */

  unsigned y;
  unsigned char* prevline = 0;

  /*bytewidth is used for filtering, is 1 when bpp < 8, number of bytes per pixel otherwise*/
  size_t bytewidth = (bpp + 7u) / 8u;
  /*the width of a scanline in bytes, not including the filter type*/
  size_t linebytes = lodepng_get_raw_size_idat(w, 1, bpp) - 1u;

  for (y = 0; y < h; ++y) {
    size_t outindex = linebytes * y;
    size_t inindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
    unsigned char filterType = in[inindex];

    CERROR_TRY_RETURN(unfilterScanline(&out[outindex], &in[inindex + 1], prevline, bytewidth, filterType, linebytes));

    prevline = &out[outindex];
  }

  return 0;
}